

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O1

Trie * __thiscall Trie::step(Trie *this,char c)

{
  pointer ppTVar1;
  ulong uVar2;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,c) == 0x24) {
    uVar2 = 0;
  }
  else if (CONCAT31(in_register_00000031,c) == 0x20) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0x1c;
    if ((byte)(c + 0x9fU) < 0x1a) {
      uVar2 = (ulong)(c + 0x21U & 0x3f);
    }
  }
  ppTVar1 = (this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)((long)(this->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)) {
    return ppTVar1[uVar2];
  }
  return (Trie *)0x0;
}

Assistant:

action char2action(char c)    // 1=EOS, 2=' ', 3..28=a..z, 29=other
{ if (c == '$') return 1;
  if (c == ' ') return 2;
  if (c >= 'a' && c <= 'z') return (action)(c - 'a' + 3);
  return 29;
}